

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

value * __thiscall mjs::regexp_object::get_source(value *__return_storage_ptr__,regexp_object *this)

{
  gc_heap_ptr_untyped local_30;
  gc_heap_ptr_untyped local_20;
  
  gc_heap_ptr_untracked<mjs::gc_string,_true>::track
            ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)&local_20,(gc_heap *)&this->source_);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_30,&local_20);
  value::value(__return_storage_ptr__,(string *)&local_30);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_30);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_20);
  return __return_storage_ptr__;
}

Assistant:

value get_source() const {
        return value{source_.track(heap())};
    }